

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetInput.cpp
# Opt level: O1

void getReplacePolicy(void)

{
  short temp;
  ushort local_a;
  
  puts("\nInput the replacement policy:");
  puts("\n\t FIFO(First In First Out):input 1");
  puts("\n\t LRU(Least Recently Used):input 2");
  puts("\n\t LFU(Least Frequently Used):input 3");
  puts("\n\t Random:input 4");
  std::istream::operator>>((istream *)&std::cin,(short *)&local_a);
  if ((*(byte *)((long)&std::cerr + *(long *)(std::cin + -0x18)) & 5) != 0) {
    std::ios::clear((int)*(long *)(std::cin + -0x18) + 0x2070d0);
    std::istream::sync();
  }
  switch(local_a) {
  case 1:
    t_replace = FIFO;
    break;
  case 2:
    t_replace = LRU;
    break;
  case 3:
    t_replace = LFU;
    break;
  case 4:
    t_replace = Random;
    break;
  default:
    getReplacePolicy();
  }
  return;
}

Assistant:

void getReplacePolicy()
{
	short temp;
	puts("\nInput the replacement policy:");
	puts("\n\t FIFO(First In First Out):input 1");
	puts("\n\t LRU(Least Recently Used):input 2");
	puts("\n\t LFU(Least Frequently Used):input 3");
	puts("\n\t Random:input 4");
	cin >> temp;
	if (cin.fail())
	{
		cin.clear();
		cin.sync();
	}
	switch (temp)
	{
	case 1:
		t_replace = FIFO;
		break;
	case 2:
		t_replace = LRU;
		break;
	case 3:
		t_replace = LFU;
		break;
	case 4:
		t_replace = Random;
		break;
	default:
		getReplacePolicy();
	}
}